

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-netcdf-type.c
# Opt level: O1

coda_netcdf_basic_type *
coda_netcdf_basic_type_new(int nc_type,int64_t offset,int record_var,int64_t length)

{
  int iVar1;
  coda_netcdf_basic_type *type;
  coda_type_number *type_00;
  coda_native_type read_type;
  
  type = (coda_netcdf_basic_type *)malloc(0x28);
  if (type == (coda_netcdf_basic_type *)0x0) {
    coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",0x28,
                   "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf-type.c"
                   ,0x7c);
  }
  else {
    type->backend = coda_backend_netcdf;
    type->definition = (coda_type *)0x0;
    type->attributes = (coda_mem_record *)0x0;
    type->offset = offset;
    type->record_var = record_var;
    if (5 < nc_type - 1U) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-netcdf-type.c"
                    ,0xa6,
                    "coda_netcdf_basic_type *coda_netcdf_basic_type_new(int, int64_t, int, int64_t)"
                   );
    }
    switch(nc_type) {
    case 1:
      type_00 = coda_type_number_new(coda_format_netcdf,coda_integer_class);
      length = 1;
      read_type = coda_native_type_int8;
      break;
    case 2:
      read_type = (uint)(1 < length) | coda_native_type_char;
      type_00 = (coda_type_number *)coda_type_text_new(coda_format_netcdf);
      break;
    case 3:
      read_type = coda_native_type_int16;
      type_00 = coda_type_number_new(coda_format_netcdf,coda_integer_class);
      length = 2;
      break;
    case 4:
      type_00 = coda_type_number_new(coda_format_netcdf,coda_integer_class);
      length = 4;
      read_type = coda_native_type_int32;
      break;
    case 5:
      type_00 = coda_type_number_new(coda_format_netcdf,coda_real_class);
      length = 4;
      read_type = coda_native_type_float;
      break;
    case 6:
      type_00 = coda_type_number_new(coda_format_netcdf,coda_real_class);
      length = 8;
      read_type = coda_native_type_double;
    }
    type->definition = (coda_type *)type_00;
    if (((type_00 != (coda_type_number *)0x0) &&
        (iVar1 = coda_type_set_read_type((coda_type *)type_00,read_type), iVar1 == 0)) &&
       (iVar1 = coda_type_set_byte_size(type->definition,length), iVar1 == 0)) {
      return type;
    }
    coda_dynamic_type_delete((coda_dynamic_type *)type);
  }
  return (coda_netcdf_basic_type *)0x0;
}

Assistant:

coda_netcdf_basic_type *coda_netcdf_basic_type_new(int nc_type, int64_t offset, int record_var, int64_t length)
{
    coda_netcdf_basic_type *type;
    coda_native_type read_type;
    int64_t byte_size;

    type = malloc(sizeof(coda_netcdf_basic_type));
    if (type == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)sizeof(coda_netcdf_basic_type), __FILE__, __LINE__);
        return NULL;
    }
    type->backend = coda_backend_netcdf;
    type->definition = NULL;
    type->attributes = NULL;
    type->offset = offset;
    type->record_var = record_var;

    switch (nc_type)
    {
        case 1:
            read_type = coda_native_type_int8;
            byte_size = 1;
            type->definition = (coda_type *)coda_type_number_new(coda_format_netcdf, coda_integer_class);
            break;
        case 2:
            read_type = (length > 1) ? coda_native_type_string : coda_native_type_char;
            byte_size = length;
            type->definition = (coda_type *)coda_type_text_new(coda_format_netcdf);
            break;
        case 3:
            read_type = coda_native_type_int16;
            byte_size = 2;
            type->definition = (coda_type *)coda_type_number_new(coda_format_netcdf, coda_integer_class);
            break;
        case 4:
            read_type = coda_native_type_int32;
            byte_size = 4;
            type->definition = (coda_type *)coda_type_number_new(coda_format_netcdf, coda_integer_class);
            break;
        case 5:
            read_type = coda_native_type_float;
            byte_size = 4;
            type->definition = (coda_type *)coda_type_number_new(coda_format_netcdf, coda_real_class);
            break;
        case 6:
            read_type = coda_native_type_double;
            byte_size = 8;
            type->definition = (coda_type *)coda_type_number_new(coda_format_netcdf, coda_real_class);
            break;
        default:
            assert(0);
            exit(1);
    }
    if (type->definition == NULL)
    {
        coda_dynamic_type_delete((coda_dynamic_type *)type);
        return NULL;
    }
    if (coda_type_set_read_type(type->definition, read_type) != 0)
    {
        coda_dynamic_type_delete((coda_dynamic_type *)type);
        return NULL;
    }
    if (coda_type_set_byte_size(type->definition, byte_size) != 0)
    {
        coda_dynamic_type_delete((coda_dynamic_type *)type);
        return NULL;
    }

    return type;
}